

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<ClassDef::Interface>::emplace<ClassDef::Interface>
          (QMovableArrayOps<ClassDef::Interface> *this,qsizetype i,Interface *args)

{
  Interface **ppIVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_80;
  Interface local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<ClassDef::Interface>).
           super_QArrayDataPointer<ClassDef::Interface>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<ClassDef::Interface>).
        super_QArrayDataPointer<ClassDef::Interface>.size == i) {
      qVar4 = QArrayDataPointer<ClassDef::Interface>::freeSpaceAtEnd
                        ((QArrayDataPointer<ClassDef::Interface> *)this);
      if (qVar4 == 0) goto LAB_0012dcfd;
      ClassDef::Interface::Interface
                ((this->super_QGenericArrayOps<ClassDef::Interface>).
                 super_QArrayDataPointer<ClassDef::Interface>.ptr +
                 (this->super_QGenericArrayOps<ClassDef::Interface>).
                 super_QArrayDataPointer<ClassDef::Interface>.size,args);
LAB_0012ddec:
      pqVar2 = &(this->super_QGenericArrayOps<ClassDef::Interface>).
                super_QArrayDataPointer<ClassDef::Interface>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0012ddab;
    }
LAB_0012dcfd:
    if (i == 0) {
      qVar4 = QArrayDataPointer<ClassDef::Interface>::freeSpaceAtBegin
                        ((QArrayDataPointer<ClassDef::Interface> *)this);
      if (qVar4 != 0) {
        ClassDef::Interface::Interface
                  ((this->super_QGenericArrayOps<ClassDef::Interface>).
                   super_QArrayDataPointer<ClassDef::Interface>.ptr + -1,args);
        ppIVar1 = &(this->super_QGenericArrayOps<ClassDef::Interface>).
                   super_QArrayDataPointer<ClassDef::Interface>.ptr;
        *ppIVar1 = *ppIVar1 + -1;
        goto LAB_0012ddec;
      }
    }
  }
  local_58.interfaceId.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_58.interfaceId.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.className.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.interfaceId.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.className.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.className.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  ClassDef::Interface::Interface(&local_58,args);
  bVar5 = (this->super_QGenericArrayOps<ClassDef::Interface>).
          super_QArrayDataPointer<ClassDef::Interface>.size != 0;
  QArrayDataPointer<ClassDef::Interface>::detachAndGrow
            ((QArrayDataPointer<ClassDef::Interface> *)this,(uint)(i == 0 && bVar5),1,
             (Interface **)0x0,(QArrayDataPointer<ClassDef::Interface> *)0x0);
  if (i == 0 && bVar5) {
    ClassDef::Interface::Interface
              ((this->super_QGenericArrayOps<ClassDef::Interface>).
               super_QArrayDataPointer<ClassDef::Interface>.ptr + -1,&local_58);
    ppIVar1 = &(this->super_QGenericArrayOps<ClassDef::Interface>).
               super_QArrayDataPointer<ClassDef::Interface>.ptr;
    *ppIVar1 = *ppIVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<ClassDef::Interface>).
              super_QArrayDataPointer<ClassDef::Interface>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<ClassDef::Interface> *)this,i,1);
    ClassDef::Interface::Interface(local_80.displaceFrom,&local_58);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  ClassDef::Interface::~Interface(&local_58);
LAB_0012ddab:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }